

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::sf_store(Forth *this)

{
  uint pointer;
  double x;
  
  requireDStackDepth(this,1,"SF!");
  requireFStackDepth(this,1,"SF!");
  pointer = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  x = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  setDataCell32(this,pointer,&x);
  return;
}

Assistant:

void sf_store() {
			REQUIRE_DSTACK_DEPTH(1, "SF!");
			REQUIRE_FSTACK_DEPTH(1, "SF!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "SF!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell32(aaddr, x);
		}